

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O1

void init_robot(int i)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)i;
  lVar1 = 0;
  robots[lVar2].status = 0;
  robots[lVar2].x = 0;
  robots[lVar2].y = 0;
  robots[lVar2].org_x = 0;
  robots[lVar2].org_y = 0;
  robots[lVar2].range = 0;
  robots[lVar2].last_x = -1;
  robots[lVar2].last_y = -1;
  robots[lVar2].speed = 0;
  robots[lVar2].last_speed = -1;
  robots[lVar2].accel = 0;
  robots[lVar2].d_speed = 0;
  robots[lVar2].heading = 0;
  robots[lVar2].last_heading = -1;
  robots[lVar2].d_heading = 0;
  robots[lVar2].damage = 0;
  robots[lVar2].last_damage = -1;
  robots[lVar2].scan = 0;
  robots[lVar2].last_scan = -1;
  robots[lVar2].reload = 0;
  do {
    *(undefined4 *)((long)&missiles[lVar2][0].stat + lVar1) = 0;
    *(undefined8 *)(lVar2 * 0x58 + 0x159024 + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x2c;
  } while (lVar1 == 0x2c);
  return;
}

Assistant:

void init_robot(int i)
{
	 int j;

	robots[i].status = DEAD;
	robots[i].x = 0;
	robots[i].y = 0;
	robots[i].org_x = 0;
	robots[i].org_y = 0;
	robots[i].range = 0;
	robots[i].last_x = -1;
	robots[i].last_y = -1;
	robots[i].speed = 0;
	robots[i].last_speed = -1;
	robots[i].accel = 0;
	robots[i].d_speed = 0;
	robots[i].heading = 0;
	robots[i].last_heading = -1;
	robots[i].d_heading = 0;
	robots[i].damage = 0;
	robots[i].last_damage = -1;
	robots[i].scan = 0;
	robots[i].last_scan = -1;
	robots[i].reload = 0;
	for (j = 0; j < MIS_ROBOT; j++) {
		missiles[i][j].stat = AVAIL;
		missiles[i][j].last_xx = -1;
		missiles[i][j].last_yy = -1;
	}
}